

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3CodeRowTrigger
               (Parse *pParse,Trigger *pTrigger,int op,ExprList *pChanges,int tr_tm,Table *pTab,
               int reg,int orconf,int ignoreJump)

{
  undefined1 *puVar1;
  int iVar2;
  sqlite3 *db;
  Vdbe *p;
  Returning *pRVar3;
  ExprList *pEVar4;
  sqlite3 *db_00;
  char cVar5;
  int iVar6;
  Expr *pEVar7;
  ExprList *pList;
  char *pcVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  ExprList_item *pEVar12;
  long lVar13;
  Select sSelect;
  SrcList sFrom;
  NameContext local_168;
  Select local_128;
  SrcList local_a8;
  
  if (pTrigger != (Trigger *)0x0) {
    do {
      if ((((uint)pTrigger->op == op) ||
          (((pTrigger->bReturning != '\0' && (op == 0x81)) && (pTrigger->op == 0x7f)))) &&
         (((uint)pTrigger->tr_tm == tr_tm &&
          (iVar6 = checkColumnOverlap(pTrigger->pColumns,pChanges), iVar6 != 0)))) {
        if (pTrigger->bReturning == '\0') {
          sqlite3CodeRowTriggerDirect(pParse,pTrigger,pTab,reg,orconf,ignoreJump);
        }
        else if (pParse->pToplevel == (Parse *)0x0) {
          db = pParse->db;
          p = pParse->pVdbe;
          pRVar3 = (pParse->u1).pReturning;
          local_128.pWin = (Window *)0x0;
          local_128.pWinDefn = (Window *)0x0;
          local_128.pLimit = (Expr *)0x0;
          local_128.pWith = (With *)0x0;
          local_128.pPrior = (Select *)0x0;
          local_128.pNext = (Select *)0x0;
          local_128.pHaving = (Expr *)0x0;
          local_128.pOrderBy = (ExprList *)0x0;
          local_128.pWhere = (Expr *)0x0;
          local_128.pGroupBy = (ExprList *)0x0;
          local_128.pEList = (ExprList *)0x0;
          local_128.pSrc = (SrcList *)0x0;
          local_128.selId = 0;
          local_128.addrOpenEphm[0] = 0;
          local_128.addrOpenEphm[1] = 0;
          local_128._28_4_ = 0;
          local_128.op = '\0';
          local_128._1_1_ = 0;
          local_128.nSelectRow = 0;
          local_128.selFlags = 0;
          local_128.iLimit = 0;
          local_128.iOffset = 0;
          local_a8.nSrc = 0;
          local_a8.nAlloc = 0;
          local_a8.a[0].pSchema = (Schema *)0x0;
          local_a8.a[0].zDatabase = (char *)0x0;
          local_a8.a[0].zName = (char *)0x0;
          local_a8.a[0].zAlias = (char *)0x0;
          local_a8.a[0].pTab = (Table *)0x0;
          local_a8.a[0].pSelect = (Select *)0x0;
          local_a8.a[0].addrFillSub = 0;
          local_a8.a[0].regReturn = 0;
          local_a8.a[0].regResult = 0;
          local_a8.a[0].fg = (anon_struct_4_15_a1681e7a_for_fg)0x0;
          local_a8.a[0].iCursor = 0;
          local_a8.a[0]._68_4_ = 0;
          local_a8.a[0].u3.pOn = (Expr *)0x0;
          local_a8.a[0].colUsed = 0;
          local_a8.a[0].u1.zIndexedBy = (char *)0x0;
          local_a8.a[0].u2.pIBIndex = (Index *)0x0;
          local_128.pEList = sqlite3ExprListDup(db,pRVar3->pReturnEL,0);
          local_128.pSrc = &local_a8;
          local_a8.nSrc = 1;
          local_a8.a[0].iCursor = -1;
          local_a8.a[0].pTab = pTab;
          sqlite3SelectPrep(pParse,&local_128,(NameContext *)0x0);
          if (pParse->nErr == 0) {
            sqlite3GenerateColumnNames(pParse,&local_128);
          }
          if (local_128.pEList != (ExprList *)0x0) {
            exprListDeleteNN(db,local_128.pEList);
          }
          pEVar4 = pRVar3->pReturnEL;
          if (pEVar4->nExpr < 1) {
            pList = (ExprList *)0x0;
          }
          else {
            db_00 = pParse->db;
            lVar13 = 0;
            pList = (ExprList *)0x0;
            do {
              pEVar7 = pEVar4->a[lVar13].pExpr;
              if (pEVar7 != (Expr *)0x0) {
                if (pEVar7->op != 0xb4) {
                  if ((pEVar7->op != 0x8d) || (pEVar7->pRight->op != 0xb4)) {
                    pEVar7 = exprDup(db_00,pEVar7,0,(u8 **)0x0);
                    pList = sqlite3ExprListAppend(pParse,pList,pEVar7);
                    if (db_00->mallocFailed == '\0') {
                      pcVar8 = pEVar4->a[lVar13].zEName;
                      if (pcVar8 != (char *)0x0) {
                        lVar10 = (long)pList->nExpr;
                        pcVar8 = sqlite3DbStrDup(db_00,pcVar8);
                        pList->a[lVar10 + -1].zEName = pcVar8;
                        *(ushort *)&pList->a[lVar10 + -1].fg.field_0x1 =
                             *(ushort *)&pList->a[lVar10 + -1].fg.field_0x1 & 0xfffc |
                             *(ushort *)&pEVar4->a[lVar13].fg.field_0x1 & 3;
                      }
                    }
                    goto LAB_0018e52c;
                  }
                  sqlite3ErrorMsg(pParse,"RETURNING may not use \"TABLE.*\" wildcards");
                }
                if (0 < pTab->nCol) {
                  lVar11 = 0;
                  lVar10 = 0;
                  do {
                    if ((*(byte *)((long)&pTab->aCol->colFlags + lVar11) & 2) == 0) {
                      pEVar7 = sqlite3Expr(db_00,0x3b,
                                           *(char **)((long)&pTab->aCol->zCnName + lVar11));
                      pList = sqlite3ExprListAppend(pParse,pList,pEVar7);
                      if (db_00->mallocFailed == '\0') {
                        iVar6 = pList->nExpr;
                        pcVar8 = sqlite3DbStrDup(db_00,*(char **)((long)&pTab->aCol->zCnName +
                                                                 lVar11));
                        pList->a[(long)iVar6 + -1].zEName = pcVar8;
                        puVar1 = &pList->a[(long)iVar6 + -1].fg.field_0x1;
                        *puVar1 = *puVar1 & 0xfc;
                      }
                    }
                    lVar10 = lVar10 + 1;
                    lVar11 = lVar11 + 0x10;
                  } while (lVar10 < pTab->nCol);
                }
              }
LAB_0018e52c:
              lVar13 = lVar13 + 1;
            } while (lVar13 < pEVar4->nExpr);
          }
          if (db->mallocFailed == '\0') {
            local_168.nRef = 0;
            local_168.nNcErr = 0;
            local_168.pNext = (NameContext *)0x0;
            local_168.pSrcList = (SrcList *)0x0;
            local_168.pWinSelect = (Select *)0x0;
            if (pRVar3->nRetCol == 0) {
              pRVar3->nRetCol = pList->nExpr;
              iVar6 = pParse->nTab;
              pParse->nTab = iVar6 + 1;
              pRVar3->iRetCur = iVar6;
            }
            local_168.uNC._4_4_ = 0;
            local_168.uNC.iBaseReg = reg;
            local_168.ncFlags = 0x400;
            local_168._44_4_ = 0;
            pParse->eTriggerOp = pTrigger->op;
            pParse->pTriggerTab = pTab;
            local_168.pParse = pParse;
            iVar6 = sqlite3ResolveExprListNames(&local_168,pList);
            if ((iVar6 == 0) && (db->mallocFailed == '\0')) {
              iVar2 = pList->nExpr;
              iVar6 = pParse->nMem + 1;
              pParse->nMem = pParse->nMem + iVar2 + 2;
              pRVar3->iRetReg = iVar6;
              if ((long)iVar2 < 1) {
                lVar13 = 0;
              }
              else {
                pEVar12 = pList->a;
                lVar13 = 0;
                do {
                  pEVar7 = pEVar12->pExpr;
                  iVar9 = iVar6 + (int)lVar13;
                  sqlite3ExprCodeFactorable(pParse,pEVar7,iVar9);
                  cVar5 = sqlite3ExprAffinity(pEVar7);
                  if (cVar5 == 'E') {
                    sqlite3VdbeAddOp3(p,0x57,iVar9,0,0);
                  }
                  lVar13 = lVar13 + 1;
                  pEVar12 = pEVar12 + 1;
                } while (iVar2 != lVar13);
              }
              iVar2 = (int)lVar13;
              sqlite3VdbeAddOp3(p,0x61,iVar6,iVar2,iVar6 + iVar2);
              iVar9 = iVar2 + iVar6 + 1;
              sqlite3VdbeAddOp3(p,0x7f,pRVar3->iRetCur,iVar9,0);
              sqlite3VdbeAddOp3(p,0x80,pRVar3->iRetCur,iVar6 + iVar2,iVar9);
            }
          }
          if (pList != (ExprList *)0x0) {
            exprListDeleteNN(db,pList);
          }
          pParse->eTriggerOp = '\0';
          pParse->pTriggerTab = (Table *)0x0;
        }
      }
      pTrigger = pTrigger->pNext;
    } while (pTrigger != (Trigger *)0x0);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3CodeRowTrigger(
  Parse *pParse,       /* Parse context */
  Trigger *pTrigger,   /* List of triggers on table pTab */
  int op,              /* One of TK_UPDATE, TK_INSERT, TK_DELETE */
  ExprList *pChanges,  /* Changes list for any UPDATE OF triggers */
  int tr_tm,           /* One of TRIGGER_BEFORE, TRIGGER_AFTER */
  Table *pTab,         /* The table to code triggers from */
  int reg,             /* The first in an array of registers (see above) */
  int orconf,          /* ON CONFLICT policy */
  int ignoreJump       /* Instruction to jump to for RAISE(IGNORE) */
){
  Trigger *p;          /* Used to iterate through pTrigger list */

  assert( op==TK_UPDATE || op==TK_INSERT || op==TK_DELETE );
  assert( tr_tm==TRIGGER_BEFORE || tr_tm==TRIGGER_AFTER );
  assert( (op==TK_UPDATE)==(pChanges!=0) );

  for(p=pTrigger; p; p=p->pNext){

    /* Sanity checking:  The schema for the trigger and for the table are
    ** always defined.  The trigger must be in the same schema as the table
    ** or else it must be a TEMP trigger. */
    assert( p->pSchema!=0 );
    assert( p->pTabSchema!=0 );
    assert( p->pSchema==p->pTabSchema
         || p->pSchema==pParse->db->aDb[1].pSchema );

    /* Determine whether we should code this trigger.  One of two choices:
    **   1. The trigger is an exact match to the current DML statement
    **   2. This is a RETURNING trigger for INSERT but we are currently
    **      doing the UPDATE part of an UPSERT.
    */
    if( (p->op==op || (p->bReturning && p->op==TK_INSERT && op==TK_UPDATE))
     && p->tr_tm==tr_tm
     && checkColumnOverlap(p->pColumns, pChanges)
    ){
      if( !p->bReturning ){
        sqlite3CodeRowTriggerDirect(pParse, p, pTab, reg, orconf, ignoreJump);
      }else if( sqlite3IsToplevel(pParse) ){
        codeReturningTrigger(pParse, p, pTab, reg);
      }
    }
  }
}